

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

int mbedtls_internal_sha512_process(mbedtls_sha512_context *ctx,uchar *data)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong auStack_338 [6];
  ulong local_308;
  uint64_t uStack_300;
  uint64_t local_2f8;
  uint64_t uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  uint64_t uStack_2d0;
  ulong auStack_2c8 [11];
  uint64_t auStack_270 [5];
  ulong auStack_248 [67];
  
  local_2d8 = ctx->state[6];
  uStack_2d0 = ctx->state[7];
  local_2e8 = ctx->state[4];
  uStack_2e0 = ctx->state[5];
  local_2f8 = ctx->state[2];
  uStack_2f0 = ctx->state[3];
  local_308 = ctx->state[0];
  uStack_300 = ctx->state[1];
  lVar1 = 0;
  do {
    uVar2 = *(ulong *)(data + lVar1 * 8);
    auStack_2c8[lVar1 + 2] =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0x10;
  do {
    uVar2 = auStack_2c8[lVar1];
    uVar3 = auStack_338[lVar1 + 1];
    auStack_2c8[lVar1 + 2] =
         (uVar2 >> 6 ^ (uVar2 << 3 | uVar2 >> 0x3d) ^ (uVar2 << 0x2d | uVar2 >> 0x13)) +
         (&uStack_2f0)[lVar1] + auStack_338[lVar1] +
         (uVar3 >> 7 ^
         (uVar3 << 0x38 | uVar3 >> 8) ^ (uVar3 >> 1 | (ulong)((uVar3 & 1) != 0) << 0x3f));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x50);
  uVar2 = 0xfffffffffffffff8;
  do {
    lVar1 = ((local_2e8 << 0x17 | local_2e8 >> 0x29) ^
            (local_2e8 << 0x2e | local_2e8 >> 0x12) ^ (local_2e8 << 0x32 | local_2e8 >> 0xe)) +
            uStack_2d0 + K[uVar2 + 8] + auStack_2c8[uVar2 + 10] +
            ((uStack_2e0 ^ local_2d8) & local_2e8 ^ local_2d8);
    uVar4 = uStack_2f0 + lVar1;
    uVar3 = ((uStack_300 | local_308) & local_2f8 | uStack_300 & local_308) +
            ((local_308 << 0x19 | local_308 >> 0x27) ^
            (local_308 << 0x1e | local_308 >> 0x22) ^ (local_308 << 0x24 | local_308 >> 0x1c)) +
            lVar1;
    lVar1 = ((uStack_2e0 ^ local_2e8) & uVar4 ^ uStack_2e0) + local_2d8 + K[uVar2 + 9] +
            ((uVar4 * 0x800000 | uVar4 >> 0x29) ^
            (uVar4 << 0x2e | uVar4 >> 0x12) ^ (uVar4 << 0x32 | uVar4 >> 0xe)) +
            auStack_2c8[uVar2 + 0xb];
    local_2f8 = local_2f8 + lVar1;
    local_2d8 = ((uVar3 | local_308) & uStack_300 | uVar3 & local_308) +
                ((uVar3 * 0x2000000 | uVar3 >> 0x27) ^
                (uVar3 * 0x40000000 | uVar3 >> 0x22) ^ (uVar3 << 0x24 | uVar3 >> 0x1c)) + lVar1;
    lVar1 = uStack_2e0 + K[uVar2 + 10] + auStack_2c8[uVar2 + 0xc] +
            ((uVar4 ^ local_2e8) & local_2f8 ^ local_2e8) +
            ((local_2f8 * 0x800000 | local_2f8 >> 0x29) ^
            (local_2f8 << 0x2e | local_2f8 >> 0x12) ^ (local_2f8 << 0x32 | local_2f8 >> 0xe));
    uStack_300 = uStack_300 + lVar1;
    uStack_2e0 = lVar1 + ((local_2d8 | uVar3) & local_308 | local_2d8 & uVar3) +
                         ((local_2d8 * 0x2000000 | local_2d8 >> 0x27) ^
                         (local_2d8 * 0x40000000 | local_2d8 >> 0x22) ^
                         (local_2d8 << 0x24 | local_2d8 >> 0x1c));
    lVar1 = local_2e8 + K[uVar2 + 0xb] + auStack_2c8[uVar2 + 0xd] +
            ((local_2f8 ^ uVar4) & uStack_300 ^ uVar4) +
            ((uStack_300 * 0x800000 | uStack_300 >> 0x29) ^
            (uStack_300 << 0x2e | uStack_300 >> 0x12) ^ (uStack_300 << 0x32 | uStack_300 >> 0xe));
    local_308 = local_308 + lVar1;
    local_2e8 = lVar1 + ((uStack_2e0 | local_2d8) & uVar3 | uStack_2e0 & local_2d8) +
                        ((uStack_2e0 * 0x2000000 | uStack_2e0 >> 0x27) ^
                        (uStack_2e0 * 0x40000000 | uStack_2e0 >> 0x22) ^
                        (uStack_2e0 << 0x24 | uStack_2e0 >> 0x1c));
    lVar1 = uVar4 + K[uVar2 + 0xc] + auStack_2c8[uVar2 + 0xe] +
            ((uStack_300 ^ local_2f8) & local_308 ^ local_2f8) +
            ((local_308 * 0x800000 | local_308 >> 0x29) ^
            (local_308 << 0x2e | local_308 >> 0x12) ^ (local_308 << 0x32 | local_308 >> 0xe));
    uStack_2d0 = uVar3 + lVar1;
    uStack_2f0 = ((local_2e8 | uStack_2e0) & local_2d8 | local_2e8 & uStack_2e0) +
                 ((local_2e8 * 0x2000000 | local_2e8 >> 0x27) ^
                 (local_2e8 * 0x40000000 | local_2e8 >> 0x22) ^
                 (local_2e8 << 0x24 | local_2e8 >> 0x1c)) + lVar1;
    lVar1 = local_2f8 + K[uVar2 + 0xd] + auStack_2c8[uVar2 + 0xf] +
            ((local_308 ^ uStack_300) & uStack_2d0 ^ uStack_300) +
            ((uStack_2d0 * 0x800000 | uStack_2d0 >> 0x29) ^
            (uStack_2d0 << 0x2e | uStack_2d0 >> 0x12) ^ (uStack_2d0 << 0x32 | uStack_2d0 >> 0xe));
    local_2d8 = local_2d8 + lVar1;
    local_2f8 = ((uStack_2f0 | local_2e8) & uStack_2e0 | uStack_2f0 & local_2e8) +
                ((uStack_2f0 * 0x2000000 | uStack_2f0 >> 0x27) ^
                (uStack_2f0 * 0x40000000 | uStack_2f0 >> 0x22) ^
                (uStack_2f0 << 0x24 | uStack_2f0 >> 0x1c)) + lVar1;
    lVar1 = uStack_300 + K[uVar2 + 0xe] + auStack_2c8[uVar2 + 0x10] +
            ((uStack_2d0 ^ local_308) & local_2d8 ^ local_308) +
            ((local_2d8 * 0x800000 | local_2d8 >> 0x29) ^
            (local_2d8 << 0x2e | local_2d8 >> 0x12) ^ (local_2d8 << 0x32 | local_2d8 >> 0xe));
    uStack_2e0 = uStack_2e0 + lVar1;
    uStack_300 = ((local_2f8 | uStack_2f0) & local_2e8 | local_2f8 & uStack_2f0) +
                 ((local_2f8 * 0x2000000 | local_2f8 >> 0x27) ^
                 (local_2f8 * 0x40000000 | local_2f8 >> 0x22) ^
                 (local_2f8 << 0x24 | local_2f8 >> 0x1c)) + lVar1;
    lVar1 = local_308 + K[uVar2 + 0xf] + auStack_2c8[uVar2 + 0x11] +
            ((local_2d8 ^ uStack_2d0) & uStack_2e0 ^ uStack_2d0) +
            ((uStack_2e0 * 0x800000 | uStack_2e0 >> 0x29) ^
            (uStack_2e0 << 0x2e | uStack_2e0 >> 0x12) ^ (uStack_2e0 << 0x32 | uStack_2e0 >> 0xe));
    local_2e8 = local_2e8 + lVar1;
    local_308 = ((uStack_300 | local_2f8) & uStack_2f0 | uStack_300 & local_2f8) +
                ((uStack_300 * 0x2000000 | uStack_300 >> 0x27) ^
                (uStack_300 * 0x40000000 | uStack_300 >> 0x22) ^
                (uStack_300 << 0x24 | uStack_300 >> 0x1c)) + lVar1;
    uVar2 = uVar2 + 8;
  } while (uVar2 < 0x48);
  lVar1 = 0;
  do {
    ctx->state[lVar1] = ctx->state[lVar1] + (&local_308)[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return 0;
}

Assistant:

int mbedtls_internal_sha512_process( mbedtls_sha512_context *ctx,
                                     const unsigned char data[128] )
{
    int i;
    uint64_t temp1, temp2, W[80];
    uint64_t A[8];

    SHA512_VALIDATE_RET( ctx != NULL );
    SHA512_VALIDATE_RET( (const unsigned char *)data != NULL );

#define  SHR(x,n) ((x) >> (n))
#define ROTR(x,n) (SHR((x),(n)) | ((x) << (64 - (n))))

#define S0(x) (ROTR(x, 1) ^ ROTR(x, 8) ^  SHR(x, 7))
#define S1(x) (ROTR(x,19) ^ ROTR(x,61) ^  SHR(x, 6))

#define S2(x) (ROTR(x,28) ^ ROTR(x,34) ^ ROTR(x,39))
#define S3(x) (ROTR(x,14) ^ ROTR(x,18) ^ ROTR(x,41))

#define F0(x,y,z) (((x) & (y)) | ((z) & ((x) | (y))))
#define F1(x,y,z) ((z) ^ ((x) & ((y) ^ (z))))

#define P(a,b,c,d,e,f,g,h,x,K)                                  \
    do                                                          \
    {                                                           \
        temp1 = (h) + S3(e) + F1((e),(f),(g)) + (K) + (x);      \
        temp2 = S2(a) + F0((a),(b),(c));                        \
        (d) += temp1; (h) = temp1 + temp2;                      \
    } while( 0 )

    for( i = 0; i < 8; i++ )
        A[i] = ctx->state[i];

#if defined(MBEDTLS_SHA512_SMALLER)
    for( i = 0; i < 80; i++ )
    {
        if( i < 16 )
        {
            GET_UINT64_BE( W[i], data, i << 3 );
        }
        else
        {
            W[i] = S1(W[i -  2]) + W[i -  7] +
                   S0(W[i - 15]) + W[i - 16];
        }

        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] );

        temp1 = A[7]; A[7] = A[6]; A[6] = A[5]; A[5] = A[4]; A[4] = A[3];
        A[3] = A[2]; A[2] = A[1]; A[1] = A[0]; A[0] = temp1;
    }
#else /* MBEDTLS_SHA512_SMALLER */
    for( i = 0; i < 16; i++ )
    {
        GET_UINT64_BE( W[i], data, i << 3 );
    }

    for( ; i < 80; i++ )
    {
        W[i] = S1(W[i -  2]) + W[i -  7] +
               S0(W[i - 15]) + W[i - 16];
    }

    i = 0;
    do
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] ); i++;
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i], K[i] ); i++;
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i], K[i] ); i++;
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i], K[i] ); i++;
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i], K[i] ); i++;
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i], K[i] ); i++;
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i], K[i] ); i++;
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i], K[i] ); i++;
    }
    while( i < 80 );
#endif /* MBEDTLS_SHA512_SMALLER */

    for( i = 0; i < 8; i++ )
        ctx->state[i] += A[i];

    return( 0 );
}